

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_strtok(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxi32 sVar1;
  undefined8 *puVar2;
  char *pcVar3;
  char *pcVar4;
  void *pDest;
  int nLen;
  int nMasklen;
  char *zInput;
  SyString sToken;
  
  if (nArg < 2) {
    puVar2 = (undefined8 *)jx9_context_peek_aux_data(pCtx);
    if (puVar2 != (undefined8 *)0x0) {
      nMasklen = 0;
      if (((nArg == 1) && (pcVar3 = jx9_value_to_string(*apArg,&nMasklen), 0 < nMasklen)) &&
         (sVar1 = ExtractToken((char **)(puVar2 + 1),(char *)puVar2[2],pcVar3,nMasklen,&sToken),
         sVar1 == 0)) {
        jx9_result_string(pCtx,sToken.zString,sToken.nByte);
        return 0;
      }
      jx9_context_free_chunk(pCtx,(void *)*puVar2);
      jx9_context_free_chunk(pCtx,puVar2);
      jx9_context_pop_aux_data(pCtx);
    }
  }
  else {
    pcVar3 = jx9_value_to_string(*apArg,&nLen);
    zInput = pcVar3;
    if (0 < nLen) {
      pcVar4 = jx9_value_to_string(apArg[1],&nMasklen);
      if (nMasklen < 1) {
        nMasklen = 5;
        pcVar4 = " \n\t\r\f";
      }
      sVar1 = ExtractToken(&zInput,pcVar3 + nLen,pcVar4,nMasklen,&sToken);
      if (sVar1 == 0) {
        jx9_result_string(pCtx,sToken.zString,sToken.nByte);
        puVar2 = (undefined8 *)jx9_context_alloc_chunk(pCtx,0x18,1,0);
        pcVar4 = zInput;
        if (puVar2 == (undefined8 *)0x0) {
          return 0;
        }
        nLen = ((int)pcVar3 - (int)zInput) + nLen;
        if (0 < nLen) {
          pDest = jx9_context_alloc_chunk(pCtx,nLen + 1,1,0);
          if (pDest == (void *)0x0) {
            return 0;
          }
          SyMemcpy(pcVar4,pDest,nLen);
          puVar2[1] = pDest;
          *puVar2 = pDest;
          puVar2[2] = (long)nLen + (long)pDest;
          jx9_context_push_aux_data(pCtx,puVar2);
          return 0;
        }
        jx9_context_free_chunk(pCtx,puVar2);
        return 0;
      }
    }
  }
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_strtok(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	strtok_aux_data *pAux;
	const char *zMask;
	SyString sToken; 
	int nMasklen;
	sxi32 rc;
	if( nArg < 2 ){
		/* Extract top aux data */
		pAux = (strtok_aux_data *)jx9_context_peek_aux_data(pCtx);
		if( pAux == 0 ){
			/* No aux data, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		nMasklen = 0;
		zMask = ""; /* cc warning */
		if( nArg > 0 ){
			/* Extract the mask */
			zMask = jx9_value_to_string(apArg[0], &nMasklen);
		}
		if( nMasklen < 1 ){
			/* Invalid mask, return FALSE */
			jx9_context_free_chunk(pCtx, (void *)pAux->zDup);
			jx9_context_free_chunk(pCtx, pAux);
			(void)jx9_context_pop_aux_data(pCtx);
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* Extract the token */
		rc = ExtractToken(&pAux->zIn, pAux->zEnd, zMask, nMasklen, &sToken);
		if( rc != SXRET_OK ){
			/* EOF , discard the aux data */
			jx9_context_free_chunk(pCtx, (void *)pAux->zDup);
			jx9_context_free_chunk(pCtx, pAux);
			(void)jx9_context_pop_aux_data(pCtx);
			jx9_result_bool(pCtx, 0);
		}else{
			/* Return the extracted token */
			jx9_result_string(pCtx, sToken.zString, (int)sToken.nByte);
		}
	}else{
		const char *zInput, *zCur;
		char *zDup;
		int nLen;
		/* Extract the raw input */
		zCur = zInput = jx9_value_to_string(apArg[0], &nLen);
		if( nLen < 1 ){
			/* Empty input, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* Extract the mask */
		zMask = jx9_value_to_string(apArg[1], &nMasklen);
		if( nMasklen < 1 ){
			/* Set a default mask */
#define TOK_MASK " \n\t\r\f" 
			zMask = TOK_MASK;
			nMasklen = (int)sizeof(TOK_MASK) - 1;
#undef TOK_MASK
		}
		/* Extract a single token */
		rc = ExtractToken(&zInput, &zInput[nLen], zMask, nMasklen, &sToken);
		if( rc != SXRET_OK ){
			/* Empty input */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}else{
			/* Return the extracted token */
			jx9_result_string(pCtx, sToken.zString, (int)sToken.nByte);
		}
		/* Create our auxilliary data and copy the input */
		pAux = (strtok_aux_data *)jx9_context_alloc_chunk(pCtx, sizeof(strtok_aux_data), TRUE, FALSE);
		if( pAux ){
			nLen -= (int)(zInput-zCur);
			if( nLen < 1 ){
				jx9_context_free_chunk(pCtx, pAux);
				return JX9_OK;
			}
			/* Duplicate input */
			zDup = (char *)jx9_context_alloc_chunk(pCtx, (unsigned int)(nLen+1), TRUE, FALSE);
			if( zDup  ){
				SyMemcpy(zInput, zDup, (sxu32)nLen);
				/* Register the aux data */
				pAux->zDup = pAux->zIn = zDup;
				pAux->zEnd = &zDup[nLen];
				jx9_context_push_aux_data(pCtx, pAux);
			}
		}
	}
	return JX9_OK;
}